

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O1

void add_indexed_operand(m680x_info *info,m680x_reg base_reg,_Bool post_inc_dec,uint8_t inc_dec,
                        uint8_t offset_bits,uint16_t offset,_Bool no_comma)

{
  uint8_t *puVar1;
  byte bVar2;
  undefined7 in_register_00000009;
  cs_m680x_op *op;
  
  bVar2 = (info->m680x).op_count;
  (info->m680x).op_count = bVar2 + 1;
  op = (info->m680x).operands + bVar2;
  op->type = M680X_OP_INDEXED;
  set_operand_size(info,op,post_inc_dec);
  (info->m680x).operands[bVar2].field_1.reg = base_reg;
  (info->m680x).operands[bVar2].field_1.idx.offset_reg = M680X_REG_INVALID;
  (info->m680x).operands[bVar2].field_1.idx.inc_dec = inc_dec;
  if ((int)CONCAT71(in_register_00000009,inc_dec) != 0 && post_inc_dec) {
    puVar1 = &(info->m680x).operands[bVar2].field_1.idx.flags;
    *puVar1 = *puVar1 | 4;
  }
  if (offset_bits != '\0') {
    (info->m680x).operands[bVar2].field_1.idx.offset = offset;
    (info->m680x).operands[bVar2].field_1.idx.offset_addr = 0;
  }
  (info->m680x).operands[bVar2].field_1.idx.offset_bits = offset_bits;
  puVar1 = &(info->m680x).operands[bVar2].field_1.idx.flags;
  *puVar1 = *puVar1 | no_comma * '\x02';
  return;
}

Assistant:

static void add_indexed_operand(m680x_info *info, m680x_reg base_reg,
	bool post_inc_dec, uint8_t inc_dec, uint8_t offset_bits,
	uint16_t offset, bool no_comma)
{
	cs_m680x *m680x = &info->m680x;
	cs_m680x_op *op = &m680x->operands[m680x->op_count++];

	op->type = M680X_OP_INDEXED;
	set_operand_size(info, op, 1);
	op->idx.base_reg = base_reg;
	op->idx.offset_reg = M680X_REG_INVALID;
	op->idx.inc_dec = inc_dec;

	if (inc_dec && post_inc_dec)
		op->idx.flags |= M680X_IDX_POST_INC_DEC;

	if (offset_bits != M680X_OFFSET_NONE) {
		op->idx.offset = offset;
		op->idx.offset_addr = 0;
	}

	op->idx.offset_bits = offset_bits;
	op->idx.flags |= (no_comma ? M680X_IDX_NO_COMMA : 0);
}